

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::RemoveAt(CopyRemovePolicy<JsUtil::List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
           *this,List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *list,int index)

{
  Type pNVar1;
  undefined8 uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  long lVar6;
  int iVar7;
  
  if ((index < 0) ||
     ((list->
      super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
      ).count <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                                ,0x2ee,"(index >= 0 && index < list->count)",
                                "index >= 0 && index < list->count");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  lVar6 = (long)(index + 1) * 0xc;
  while( true ) {
    iVar7 = (list->
            super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
            ).count;
    if (iVar7 <= index + 1) break;
    pNVar1 = (list->
             super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
             ).buffer;
    pNVar1[index].nativeOffsetSpan.end = *(Type *)((long)&(pNVar1->nativeOffsetSpan).end + lVar6);
    uVar2 = *(undefined8 *)((long)&pNVar1->statementIndex + lVar6);
    pNVar1[index].statementIndex = (int)uVar2;
    pNVar1[index].nativeOffsetSpan.begin = (int)((ulong)uVar2 >> 0x20);
    lVar6 = lVar6 + 0xc;
    index = index + 1;
  }
  iVar7 = iVar7 + -1;
  (list->
  super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>)
  .count = iVar7;
  pNVar1 = (list->
           super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
           ).buffer;
  pNVar1[iVar7].nativeOffsetSpan.end = 0;
  pNVar1 = pNVar1 + iVar7;
  pNVar1->statementIndex = 0;
  (pNVar1->nativeOffsetSpan).begin = 0;
  return;
}

Assistant:

void RemoveAt(TListType* list, int index)
        {
            Assert(index >= 0 && index < list->count);
            for (int j = index + 1; j < list->count; index++, j++)
            {
                list->buffer[index] = list->buffer[j];
            }
            list->count--;

            if (clearOldEntries)
            {
                ClearArray(list->buffer + list->count, 1);
            }
        }